

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::~IfcComplexProperty(IfcComplexProperty *this)

{
  undefined1 *puVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  pointer pLVar4;
  
  *(undefined8 *)&this[-1].super_IfcProperty.field_0x60 = 0x89d6b8;
  *(undefined8 *)((long)&(this->super_IfcProperty).Description.ptr.field_2 + 8) = 0x89d708;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x89d6e0;
  pcVar2 = (this->super_IfcProperty).Description.ptr._M_dataplus._M_p;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(this->super_IfcProperty).Description.ptr.field_2._M_allocated_capacity -
                           (long)pcVar2);
  }
  puVar3 = *(undefined1 **)
            &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>
             .field_0x10;
  puVar1 = &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
            field_0x20;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcProperty.field_0x60 = 0x89d730;
  *(undefined8 *)((long)&(this->super_IfcProperty).Description.ptr.field_2 + 8) = 0x89d758;
  pLVar4 = this[-1].HasProperties.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar4 != (pointer)&this[-1].field_0xa0) {
    operator_delete(pLVar4,*(long *)&this[-1].field_0xa0 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x70 != &this[-1].field_0x80) {
    operator_delete(*(undefined1 **)&this[-1].field_0x70,*(long *)&this[-1].field_0x80 + 1);
  }
  operator_delete(&this[-1].super_IfcProperty.field_0x60,0xb8);
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}